

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

void polymul_internal::taylor_inplace_multiplier<double,_2,_2,_6,_1>::mul(double *p1,double *p2)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  
  iVar2 = binomial(3,1);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    p1[iVar2 + lVar4] = p1[lVar4 + 1] * p2[1] + p1[iVar2 + lVar4];
    p1[(long)iVar2 + lVar4 + 1] = p1[lVar4 + 1] * p2[2] + p1[(long)iVar2 + lVar4 + 1];
    lVar4 = 1;
    bVar1 = false;
  } while (bVar3);
  taylor_inplace_multiplier<double,_2,_2,_6,_2>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype p1[], const numtype p2[]) {
    if (i2 <= Ndeg2) {
      // M1(Ndeg-i2)*M2(i2) -> M1(Ndeg)
      polynomial_multiplier<numtype, Nvar - 1, Ndeg - i2, i2>::mul(
          p1 + binomial(Nvar + Ndeg - 1, Ndeg - 1),
          p1 + binomial(Nvar + Ndeg - i2 - 1, Ndeg - i2 - 1),
          p2 + binomial(Nvar + i2 - 1, i2 - 1));
    }
    taylor_inplace_multiplier<numtype, Nvar, Ndeg, Ndeg2, i2 + 1> // Back to (2), or
                                                                  // to (3) when i2+1
                                                                  // == Ndeg
        ::mul(p1, p2);
  }